

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_03.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long *plVar1;
  int number2;
  int number1;
  int local_30;
  int local_2c;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter first integer: ",0x15);
  std::istream::operator>>((istream *)&std::cin,&local_2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter second integer: ",0x16);
  std::istream::operator>>((istream *)&std::cin,&local_30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sum is ",7);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_30 + local_2c);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, const char *argv[]) {
    // variable declarations
    int number1;  // first integer to add
    int number2;  // second integer to add
    int sum;      // sum of number1 and number2

    std::cout << "Enter first integer: ";  // prompt user for data
    std::cin >> number1;  // read the first integer from user into number1

    std::cout << "Enter second integer: ";  // prompt user for data
    std::cin >> number2;  // read the second integer from user into number2

    sum = number1 + number2;

    std::cout << "Sum is " << sum << std::endl;

    return 0;
}